

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack17(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[1];
  *out = (uint)uVar1 << 0x11 | (uint)*in & 0x1ffff;
  out[1] = ((uint)uVar1 >> 0xf & 3) + ((uint)in[2] & 0x1ffff) * 4;
  Unroller<(unsigned_short)17,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack17(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<17>::Pack(in, out);
}